

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O3

void thief_yell(CHAR_DATA *ch,CHAR_DATA *victim)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  char buf [4608];
  char acStack_1218 [4608];
  
  uVar3 = number_range(0,3);
  if (uVar3 < 4) {
    iVar1 = *(int *)(&DAT_003e3614 + (ulong)uVar3 * 4);
    pcVar4 = pers(ch,victim);
    sprintf(acStack_1218,&DAT_003e3614 + iVar1,pcVar4);
  }
  bVar2 = is_awake(victim);
  if (!bVar2) {
    victim->position = 8;
    update_pos(victim);
  }
  bVar2 = is_npc(victim);
  if (!bVar2) {
    do_myell(victim,acStack_1218,ch);
  }
  one_hit(victim,ch,-1);
  return;
}

Assistant:

void thief_yell(CHAR_DATA *ch, CHAR_DATA *victim)
{
	char buf[MSL];

	switch (number_range(0, 3))
	{
		case 0:
		case 1:
			sprintf(buf, "%s is a lousy thief!", pers(ch, victim));
			break;
		case 2:
			sprintf(buf, "%s tried to rob me!", pers(ch, victim));
			break;
		case 3:
			sprintf(buf, "Keep your hands out of there, %s!", pers(ch, victim));
			break;
	}

	if (!is_awake(victim))
	{
		victim->position = POS_STANDING;
		update_pos(victim);
	}

	if (!is_npc(victim))
		do_myell(victim, buf, ch);

	one_hit(victim, ch, TYPE_UNDEFINED);
}